

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::StringPtr_const&,char_const(&)[84]>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [84])

{
  StringPtr *value;
  char (*value_00) [84];
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  StringPtr *local_20;
  char (*params_local_1) [84];
  StringPtr *params_local;
  
  local_20 = params;
  params_local_1 = (char (*) [84])this;
  params_local = (StringPtr *)__return_storage_ptr__;
  value = fwd<kj::StringPtr_const&>((StringPtr *)this);
  local_30 = toCharSequence<kj::StringPtr_const&>(value);
  value_00 = ::const((char (*) [84])local_20);
  local_40 = toCharSequence<char_const(&)[84]>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}